

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

Float __thiscall
pbrt::RealisticCamera::TraceLensesFromFilm(RealisticCamera *this,Ray *rCamera,Ray *rOut)

{
  undefined8 uVar1;
  Vector3f d;
  Vector3f d_00;
  Point3f o;
  WrapMode2D wrapMode;
  Normal3f n_00;
  Vector3f wi;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  const_reference pvVar5;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  float fVar6;
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  Point3f PVar11;
  Vector3<float> VVar12;
  Float eta_t;
  Float eta_i;
  Vector3f w;
  Point2f uv;
  Point3f pHit;
  Float zCenter;
  Float radius;
  bool isStop;
  Normal3f n;
  Float t;
  LensElementInterface *element;
  int i;
  Ray rLens;
  Float weight;
  Float elementZ;
  float in_stack_fffffffffffffdc8;
  float fVar13;
  Float in_stack_fffffffffffffdcc;
  Float x;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uVar14;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 uVar15;
  WrapMode in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  Float in_stack_fffffffffffffde4;
  float in_stack_fffffffffffffdec;
  long in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 uVar16;
  float fVar17;
  undefined4 uStack_1ec;
  undefined4 in_stack_fffffffffffffe18;
  Float in_stack_fffffffffffffe1c;
  float in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe7c;
  Image *in_stack_fffffffffffffe80;
  WrapMode in_stack_fffffffffffffe88;
  WrapMode in_stack_fffffffffffffe8c;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffe90;
  float local_f4;
  Vector3f *in_stack_ffffffffffffff10;
  Float *in_stack_ffffffffffffff18;
  undefined4 local_e0;
  Float in_stack_ffffffffffffff24;
  float v;
  float v_00;
  Image *local_b0;
  WrapMode in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff68;
  int iVar18;
  Float in_stack_ffffffffffffff7c;
  Ray *local_68;
  undefined8 local_5c;
  float local_48;
  float local_3c;
  Float local_28;
  float local_24;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  
  fVar17 = (float)in_RDI;
  uStack_1ec = (undefined4)((ulong)in_RDI >> 0x20);
  local_24 = 0.0;
  local_28 = 1.0;
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,0.0);
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,0.0);
  uVar16 = *(undefined4 *)(in_RSI + 0x18);
  Medium::TaggedPointer
            ((Medium *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (nullptr_t)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  PVar11.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar16;
  PVar11.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffe08;
  PVar11.super_Tuple3<pbrt::Point3,_float>.z = fVar17;
  d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffdf0;
  d.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  d.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffdec;
  Ray::Ray((Ray *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),PVar11,d,
           in_stack_fffffffffffffdcc,(Medium *)0x8a8505);
  sVar4 = pstd::
          vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
          ::size((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                  *)(CONCAT44(uStack_1ec,fVar17) + 0x390));
  iVar18 = (int)sVar4;
  do {
    do {
      iVar18 = iVar18 + -1;
      if (iVar18 < 0) {
        if (in_RDX != 0) {
          fVar13 = -0.0;
          x = -0.0;
          uVar14 = 0x80000000;
          uVar15 = 0x80000000;
          Point3<float>::Point3((Point3<float> *)&DAT_8000000080000000,-0.0,-0.0,0.0);
          Vector3<float>::Vector3((Vector3<float> *)CONCAT44(uVar15,uVar14),x,fVar13,0.0);
          Medium::TaggedPointer((Medium *)CONCAT44(uVar15,uVar14),(nullptr_t)CONCAT44(x,fVar13));
          o.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar16;
          o.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffe08;
          o.super_Tuple3<pbrt::Point3,_float>.z = fVar17;
          d_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffdf0;
          d_00.super_Tuple3<pbrt::Vector3,_float>.z =
               (float)(int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
          d_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffdec;
          Ray::Ray((Ray *)CONCAT44(uVar15,uVar14),o,d_00,x,(Medium *)0x8a8b78);
          Ray::operator=((Ray *)CONCAT44(uVar15,uVar14),(Ray *)CONCAT44(x,fVar13));
        }
        return local_28;
      }
      pvVar5 = pstd::
               vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
               ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                             *)(CONCAT44(uStack_1ec,fVar17) + 0x390),(long)iVar18);
      fVar13 = SUB84(pvVar5,0);
      uVar14 = (undefined4)((ulong)pvVar5 >> 0x20);
      local_24 = local_24 - pvVar5->thickness;
      Normal3<float>::Normal3((Normal3<float> *)0x8a8580);
      bVar3 = *(float *)CONCAT44(uVar14,fVar13) != 0.0;
      if (bVar3) {
        bVar2 = IntersectSphericalElement
                          ((Float)local_5c,in_stack_ffffffffffffff7c,local_68,
                           (Float *)CONCAT44(iVar18,in_stack_ffffffffffffff68),
                           (Normal3f *)CONCAT44(uVar14,fVar13));
        if (!bVar2) {
          return 0.0;
        }
      }
      else {
        in_stack_ffffffffffffff5c = (local_24 - local_48) / local_3c;
        if (in_stack_ffffffffffffff5c < 0.0) {
          return 0.0;
        }
      }
      auVar10 = (undefined1  [56])0x0;
      PVar11 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                               in_stack_fffffffffffffe1c);
      local_48 = PVar11.super_Tuple3<pbrt::Point3,_float>.z;
      auVar7._0_8_ = PVar11.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar7._8_56_ = auVar10;
      uVar1 = vmovlpd_avx(auVar7._0_16_);
      v = (float)uVar1;
      v_00 = (float)((ulong)uVar1 >> 0x20);
      if ((bVar3) ||
         (bVar2 = Image::operator_cast_to_bool((Image *)(CONCAT44(uStack_1ec,fVar17) + 0x3b0)),
         !bVar2)) {
        in_stack_fffffffffffffdec = Sqr<float>(v);
        fVar6 = Sqr<float>(v_00);
        in_stack_fffffffffffffdec = in_stack_fffffffffffffdec + fVar6;
        fVar6 = Sqr<float>(*(float *)(CONCAT44(uVar14,fVar13) + 0xc));
        if (fVar6 < in_stack_fffffffffffffdec) {
          return 0.0;
        }
      }
      else {
        Point2<float>::Point2
                  ((Point2<float> *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8);
        in_stack_fffffffffffffdf0 = CONCAT44(uStack_1ec,fVar17) + 0x3b0;
        in_stack_ffffffffffffff18 = (Float *)CONCAT44(in_stack_ffffffffffffff24,local_e0);
        WrapMode2D::WrapMode2D
                  ((WrapMode2D *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                   in_stack_fffffffffffffddc);
        wrapMode.wrap.values[1] = in_stack_fffffffffffffe8c;
        wrapMode.wrap.values[0] = in_stack_fffffffffffffe88;
        local_28 = Image::BilerpChannel
                             (in_stack_fffffffffffffe80,(Point2f)in_stack_fffffffffffffe90,
                              in_stack_fffffffffffffe7c,wrapMode);
        if ((local_28 == 0.0) && (!NAN(local_28))) {
          return 0.0;
        }
      }
    } while (!bVar3);
    fVar6 = local_48;
    Vector3<float>::Vector3((Vector3<float> *)0x8a8859);
    if (iVar18 < 1) {
LAB_008a88d5:
      in_stack_fffffffffffffde4 = 1.0;
      in_stack_fffffffffffffe88 = in_stack_ffffffffffffff58;
    }
    else {
      pvVar5 = pstd::
               vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
               ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                             *)(CONCAT44(uStack_1ec,fVar17) + 0x390),(long)(iVar18 + -1));
      if ((pvVar5->eta == 0.0) && (!NAN(pvVar5->eta))) goto LAB_008a88d5;
      pvVar5 = pstd::
               vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
               ::operator[]((vector<pbrt::RealisticCamera::LensElementInterface,_pstd::pmr::polymorphic_allocator<pbrt::RealisticCamera::LensElementInterface>_>
                             *)(CONCAT44(uStack_1ec,fVar17) + 0x390),(long)(iVar18 + -1));
      in_stack_fffffffffffffde4 = pvVar5->eta;
      in_stack_fffffffffffffe88 = in_stack_ffffffffffffff58;
    }
    auVar10 = (undefined1  [56])0x0;
    VVar12 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    auVar8._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar10;
    vmovlpd_avx(auVar8._0_16_);
    auVar10 = ZEXT856(0);
    VVar12.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffe1c;
    VVar12.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe18;
    VVar12.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe20;
    VVar12 = Normalize<float>(VVar12);
    auVar9._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar9._8_56_ = auVar10;
    in_stack_fffffffffffffe90 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar9._0_16_);
    wi.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_ffffffffffffff5c;
    wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe88;
    wi.super_Tuple3<pbrt::Vector3,_float>.z = fVar13;
    n_00.super_Tuple3<pbrt::Normal3,_float>.y = v_00;
    n_00.super_Tuple3<pbrt::Normal3,_float>.x = v;
    n_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar6;
    in_stack_fffffffffffffe80 = local_b0;
    in_stack_ffffffffffffff58 = in_stack_fffffffffffffe88;
    bVar3 = Refract(wi,n_00,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18,
                    in_stack_ffffffffffffff10);
    if (!bVar3) {
      return 0.0;
    }
    local_3c = local_f4;
  } while( true );
}

Assistant:

PBRT_CPU_GPU Float RealisticCamera::TraceLensesFromFilm(const Ray &rCamera, Ray *rOut) const {
    Float elementZ = 0, weight = 1;
    // Transform _rCamera_ from camera to lens system space
    Ray rLens(Point3f(rCamera.o.x, rCamera.o.y, -rCamera.o.z),
              Vector3f(rCamera.d.x, rCamera.d.y, -rCamera.d.z), rCamera.time);

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        // Update ray from film accounting for interaction with _element_
        elementZ -= element.thickness;
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        bool isStop = (element.curvatureRadius == 0);
        if (isStop) {
            // Compute _t_ at plane of aperture stop
            t = (elementZ - rLens.o.z) / rLens.d.z;
            if (t < 0)
                return 0;

        } else {
            // Intersect ray with element to compute _t_ and _n_
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, rLens, &t, &n))
                return 0;
        }
        DCHECK_GE(t, 0);

        // Test intersection point against element aperture
        Point3f pHit = rLens(t);
        if (isStop && apertureImage) {
            // Check intersection point against _apertureImage_
            Point2f uv((pHit.x / element.apertureRadius + 1) / 2,
                       (pHit.y / element.apertureRadius + 1) / 2);
            weight = apertureImage.BilerpChannel(uv, 0, WrapMode::Black);
            if (weight == 0)
                return 0;

        } else {
            // Check intersection point against spherical aperture
            if (Sqr(pHit.x) + Sqr(pHit.y) > Sqr(element.apertureRadius))
                return 0;
        }
        rLens.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f w;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-rLens.d), n, eta_t / eta_i, nullptr, &w))
                return 0;
            rLens.d = w;
        }
    }
    // Transform lens system space ray back to camera space
    if (rOut)
        *rOut = Ray(Point3f(rLens.o.x, rLens.o.y, -rLens.o.z),
                    Vector3f(rLens.d.x, rLens.d.y, -rLens.d.z), rLens.time);

    return weight;
}